

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O3

int Scl_CommandReadScl(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  SC_Lib *pScl;
  char *pcVar4;
  char *__format;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"dh"), iVar2 == 100) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if ((iVar2 == -1) && (globalUtilOptind + 1 == argc)) {
    pcVar4 = argv[globalUtilOptind];
    pFVar3 = fopen(pcVar4,"rb");
    if (pFVar3 == (FILE *)0x0) {
      pFVar3 = (FILE *)pAbc->Err;
      __format = "Cannot open input file \"%s\". \n";
    }
    else {
      fclose(pFVar3);
      pScl = Abc_SclReadFromFile(pcVar4);
      if (pScl != (SC_Lib *)0x0) {
        if ((SC_Lib *)pAbc->pLibScl != (SC_Lib *)0x0) {
          Abc_SclLibFree((SC_Lib *)pAbc->pLibScl);
        }
        pAbc->pLibScl = pScl;
        if (bVar1) {
          pcVar4 = Extra_FileNameGenericAppend(pcVar4,"_temp.lib");
          Abc_SclWriteLiberty(pcVar4,(SC_Lib *)pAbc->pLibScl);
          pScl = (SC_Lib *)pAbc->pLibScl;
          if (pScl == (SC_Lib *)0x0) {
            return 0;
          }
        }
        Abc_SclInstallGenlib(pScl,0.0,0.0,0);
        Mio_LibraryTransferCellIds();
        return 0;
      }
      pFVar3 = (FILE *)pAbc->Err;
      __format = "Reading SCL library from file \"%s\" has failed. \n";
    }
    fprintf(pFVar3,__format,pcVar4);
  }
  else {
    fwrite("usage: read_scl [-dh] <file>\n",0x1d,1,(FILE *)pAbc->Err);
    fwrite("\t         reads extracted Liberty library from file\n",0x34,1,(FILE *)pAbc->Err);
    pcVar4 = "yes";
    if (!bVar1) {
      pcVar4 = "no";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-d     : toggle dumping the parsed library into file \"*_temp.lib\" [default = %s]\n"
            ,pcVar4);
    fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
    fwrite("\t<file> : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
  }
  return 1;
}

Assistant:

int Scl_CommandReadScl( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    SC_Lib * pLib;
    char * pFileName;
    int c, fDump = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "dh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'd':
            fDump ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;

    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "rb" )) == NULL )
    {
        fprintf( pAbc->Err, "Cannot open input file \"%s\". \n", pFileName );
        return 1;
    }
    fclose( pFile );

    // read new library
    pLib = Abc_SclReadFromFile( pFileName );
    if ( pLib == NULL )
    {
        fprintf( pAbc->Err, "Reading SCL library from file \"%s\" has failed. \n", pFileName );
        return 1;
    }
    Abc_SclLoad( pLib, (SC_Lib **)&pAbc->pLibScl );
    if ( fDump )
        Abc_SclWriteLiberty( Extra_FileNameGenericAppend(pFileName, "_temp.lib"), (SC_Lib *)pAbc->pLibScl );
    // extract genlib library
    if ( pAbc->pLibScl )
    {
        Abc_SclInstallGenlib( pAbc->pLibScl, 0, 0, 0 );
        Mio_LibraryTransferCellIds();
    }
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_scl [-dh] <file>\n" );
    fprintf( pAbc->Err, "\t         reads extracted Liberty library from file\n" );
    fprintf( pAbc->Err, "\t-d     : toggle dumping the parsed library into file \"*_temp.lib\" [default = %s]\n", fDump? "yes": "no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\t<file> : the name of a file to read\n" );
    return 1;
}